

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_compareCString_firstLessThanSecond_fn(int _i)

{
  AString string;
  AString string_00;
  AString string_01;
  int iVar1;
  char *in_stack_fffffffffffffd50;
  uintmax_t _ck_y_19;
  uintmax_t _ck_x_23;
  uintmax_t _ck_y_18;
  uintmax_t _ck_x_22;
  char *_ck_y_q_3;
  char *_ck_x_q_3;
  char *_ck_y_s_3;
  char *_ck_x_s_3;
  char *_ck_y_17;
  char *_ck_x_21;
  void *_ck_x_20;
  uintmax_t _ck_y_16;
  uintmax_t _ck_x_19;
  intmax_t _ck_y_15;
  intmax_t _ck_x_18;
  uintmax_t _ck_y_14;
  uintmax_t _ck_x_17;
  uintmax_t _ck_y_13;
  uintmax_t _ck_x_16;
  char *_ck_y_q_2;
  char *_ck_x_q_2;
  char *_ck_y_s_2;
  char *_ck_x_s_2;
  char *_ck_y_12;
  char *_ck_x_15;
  void *_ck_x_14;
  uintmax_t _ck_y_11;
  uintmax_t _ck_x_13;
  intmax_t _ck_y_10;
  intmax_t _ck_x_12;
  uintmax_t _ck_y_9;
  uintmax_t _ck_x_11;
  uintmax_t _ck_y_8;
  uintmax_t _ck_x_10;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_7;
  char *_ck_x_9;
  void *_ck_x_8;
  uintmax_t _ck_y_6;
  uintmax_t _ck_x_7;
  intmax_t _ck_y_5;
  intmax_t _ck_x_6;
  uintmax_t _ck_y_4;
  uintmax_t _ck_x_5;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_4;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_2;
  char *_ck_x_3;
  void *_ck_x_2;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  intmax_t _ck_y;
  intmax_t _ck_x;
  AString string3;
  AString string2;
  AString string1;
  int _i_local;
  
  private_ACUtilsTest_AString_constructTestString((AString *)&string2.buffer,"",8);
  private_ACUtilsTest_AString_constructTestString((AString *)&string3.buffer,"a",8);
  private_ACUtilsTest_AString_constructTestString((AString *)&_ck_x,"b",8);
  private_ACUtilsTest_AString_setReallocFail(false,0);
  iVar1 = AString_compareCString((AString *)&string2.buffer,"a");
  if (-1 < (long)iVar1) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x925,"Assertion \'_ck_x < _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %jd, %s == %jd",
                      "AString_compareCString(&string1, \"a\") < 0",
                      "AString_compareCString(&string1, \"a\")",(long)iVar1,"0",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x925);
  if (string1.size != 8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x926,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string1).capacity == (8)",
                      "(string1).capacity",string1.size,"(8)",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x926);
  if (string1.capacity == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x926,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (string1).buffer != NULL",
                      "(void*) (string1).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x926);
  if (string1.capacity == 0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar1 = strcmp("",(char *)string1.capacity);
    _ck_y_s = (char *)string1.capacity;
    if (iVar1 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x926);
      if (string1.deallocator != (ACUtilsDeallocator)0x0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x926,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string1).size == strlen(\"\")","(string1).size",string1.deallocator,
                          "strlen(\"\")",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x926);
      if (private_ACUtilsTest_AString_reallocCount != 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x927,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "private_ACUtilsTest_AString_reallocCount == (0)",
                          "private_ACUtilsTest_AString_reallocCount",
                          private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x927);
      iVar1 = AString_compareCString((AString *)&string3.buffer,"b");
      if (-1 < (long)iVar1) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x928,"Assertion \'_ck_x < _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %jd, %s == %jd",
                          "AString_compareCString(&string2, \"b\") < 0",
                          "AString_compareCString(&string2, \"b\")",(long)iVar1,"0",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x928);
      if (string2.size != 8) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x929,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string2).capacity == (8)","(string2).capacity",string2.size,"(8)",8,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x929);
      if (string2.capacity == 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x929,"Assertion \'_ck_x != NULL\' failed",
                          "Assertion \'%s\' failed: %s == %#x","(void*) (string2).buffer != NULL",
                          "(void*) (string2).buffer",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x929);
      _ck_y_s_1 = (char *)string2.capacity;
      if (string2.capacity == 0) {
        _ck_y_q_1 = "";
        _ck_y_s_1 = "(null)";
      }
      else {
        _ck_y_q_1 = "\"";
        iVar1 = strcmp("a",(char *)string2.capacity);
        if (iVar1 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x929);
          if (string2.deallocator != (ACUtilsDeallocator)0x1) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x929,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "(string2).size == strlen(\"a\")","(string2).size",string2.deallocator
                              ,"strlen(\"a\")",1,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x929);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x92a,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "private_ACUtilsTest_AString_reallocCount == (0)",
                              "private_ACUtilsTest_AString_reallocCount",
                              private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x92a);
          iVar1 = AString_compareCString((AString *)&string3.buffer,"ba");
          if (-1 < (long)iVar1) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x92b,"Assertion \'_ck_x < _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %jd, %s == %jd",
                              "AString_compareCString(&string2, \"ba\") < 0",
                              "AString_compareCString(&string2, \"ba\")",(long)iVar1,"0",0,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x92b);
          if (string2.size != 8) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x92c,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "(string2).capacity == (8)","(string2).capacity",string2.size,"(8)",8,
                              0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x92c);
          if (string2.capacity == 0) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x92c,"Assertion \'_ck_x != NULL\' failed",
                              "Assertion \'%s\' failed: %s == %#x",
                              "(void*) (string2).buffer != NULL","(void*) (string2).buffer",0,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x92c);
          _ck_y_s_2 = (char *)string2.capacity;
          if (string2.capacity == 0) {
            _ck_y_q_2 = "";
            _ck_y_s_2 = "(null)";
          }
          else {
            _ck_y_q_2 = "\"";
            iVar1 = strcmp("a",(char *)string2.capacity);
            if (iVar1 == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x92c);
              if (string2.deallocator != (ACUtilsDeallocator)0x1) {
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x92c,"Assertion \'_ck_x == _ck_y\' failed",
                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                  "(string2).size == strlen(\"a\")","(string2).size",
                                  string2.deallocator,"strlen(\"a\")",1,0);
              }
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x92c);
              if (private_ACUtilsTest_AString_reallocCount != 0) {
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x92d,"Assertion \'_ck_x == _ck_y\' failed",
                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                  "private_ACUtilsTest_AString_reallocCount == (0)",
                                  "private_ACUtilsTest_AString_reallocCount",
                                  private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
              }
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x92d);
              iVar1 = AString_compareCString((AString *)&_ck_x,"ba");
              if (-1 < (long)iVar1) {
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x92e,"Assertion \'_ck_x < _ck_y\' failed",
                                  "Assertion \'%s\' failed: %s == %jd, %s == %jd",
                                  "AString_compareCString(&string3, \"ba\") < 0",
                                  "AString_compareCString(&string3, \"ba\")",(long)iVar1,"0",0,0);
              }
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x92e);
              if (string3.size == 8) {
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x92f);
                if (string3.capacity == 0) {
                  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0x92f,"Assertion \'_ck_x != NULL\' failed",
                                    "Assertion \'%s\' failed: %s == %#x",
                                    "(void*) (string3).buffer != NULL","(void*) (string3).buffer",0,
                                    0);
                }
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x92f);
                _ck_y_s_3 = (char *)string3.capacity;
                if (string3.capacity == 0) {
                  _ck_y_q_3 = "";
                  _ck_y_s_3 = "(null)";
                }
                else {
                  _ck_y_q_3 = "\"";
                  iVar1 = strcmp("b",(char *)string3.capacity);
                  if (iVar1 == 0) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x92f);
                    if (string3.deallocator != (ACUtilsDeallocator)0x1) {
                      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0x92f,"Assertion \'_ck_x == _ck_y\' failed",
                                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                        "(string3).size == strlen(\"b\")","(string3).size",
                                        string3.deallocator,"strlen(\"b\")",1,0);
                    }
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x92f);
                    if (private_ACUtilsTest_AString_reallocCount == 0) {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x930);
                      string.deallocator = (ACUtilsDeallocator)0x0;
                      string.reallocator = string1.reallocator;
                      string.size = 8;
                      string.capacity = string1.capacity;
                      string.buffer = in_stack_fffffffffffffd50;
                      private_ACUtilsTest_AString_destructTestString(string);
                      string_00.deallocator = string2.deallocator;
                      string_00.reallocator = string2.reallocator;
                      string_00.size = string2.size;
                      string_00.capacity = string2.capacity;
                      string_00.buffer = in_stack_fffffffffffffd50;
                      private_ACUtilsTest_AString_destructTestString(string_00);
                      string_01.deallocator = string3.deallocator;
                      string_01.reallocator = string3.reallocator;
                      string_01.size = string3.size;
                      string_01.capacity = string3.capacity;
                      string_01.buffer = in_stack_fffffffffffffd50;
                      private_ACUtilsTest_AString_destructTestString(string_01);
                      return;
                    }
                    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x930,"Assertion \'_ck_x == _ck_y\' failed",
                                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                      "private_ACUtilsTest_AString_reallocCount == (0)",
                                      "private_ACUtilsTest_AString_reallocCount",
                                      private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
                  }
                }
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x92f,
                                  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                  ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                  "(string3).buffer == (\"b\")","(string3).buffer",_ck_y_q_3,
                                  _ck_y_s_3,_ck_y_q_3,"(\"b\")","\"","b","\"",0);
              }
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x92f,"Assertion \'_ck_x == _ck_y\' failed",
                                "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                "(string3).capacity == (8)","(string3).capacity",string3.size,"(8)",
                                8,0);
            }
          }
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x92c,
                            "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                            ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                            "(string2).buffer == (\"a\")","(string2).buffer",_ck_y_q_2,_ck_y_s_2,
                            _ck_y_q_2,"(\"a\")","\"","a","\"",0);
        }
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x929,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(string2).buffer == (\"a\")","(string2).buffer",_ck_y_q_1,_ck_y_s_1,
                        _ck_y_q_1,"(\"a\")","\"","a","\"",0);
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x926,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(string1).buffer == (\"\")","(string1).buffer",_ck_y_q,_ck_y_s,_ck_y_q,"(\"\")"
                    ,"\"","","\"",0);
}

Assistant:

END_TEST
START_TEST(test_AString_compareCString_firstLessThanSecond)
{
    struct AString string1 = private_ACUtilsTest_AString_constructTestString("", 8);
    struct AString string2 = private_ACUtilsTest_AString_constructTestString("a", 8);
    struct AString string3 = private_ACUtilsTest_AString_constructTestString("b", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT_INT_LT(AString_compareCString(&string1, "a"), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string1, "", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_LT(AString_compareCString(&string2, "b"), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string2, "a", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_LT(AString_compareCString(&string2, "ba"), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string2, "a", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_LT(AString_compareCString(&string3, "ba"), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string3, "b", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string1);
    private_ACUtilsTest_AString_destructTestString(string2);
    private_ACUtilsTest_AString_destructTestString(string3);
}